

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_constant_names.c
# Opt level: O1

void append_with_group(char **buffer,size_t buffer_size,size_t *required_size,char *string,
                      size_t length,psa_dh_group_t group)

{
  long lVar1;
  char *pcVar2;
  size_t __n;
  unsigned_long value;
  char *__s;
  
  pcVar2 = (char *)0x0;
  if ((int)length == 3) {
    pcVar2 = "PSA_DH_GROUP_RFC7919";
  }
  __s = "PSA_DH_GROUP_CUSTOM";
  if ((int)length != 0x7e) {
    __s = pcVar2;
  }
  lVar1 = *(long *)buffer_size;
  *(char **)buffer_size = string + lVar1;
  value = length;
  if (string + lVar1 < (char *)0xc8) {
    memcpy(*buffer,required_size,(size_t)string);
    *buffer = *buffer + (long)string;
  }
  lVar1 = *(long *)buffer_size;
  *(ulong *)buffer_size = lVar1 + 1U;
  if (lVar1 + 1U < 200) {
    **buffer = '(';
    *buffer = *buffer + 1;
  }
  if (__s == (char *)0x0) {
    append_integer(buffer,buffer_size,(size_t *)"0x%02x",(char *)(length & 0xff),value);
  }
  else {
    __n = strlen(__s);
    lVar1 = *(long *)buffer_size;
    *(size_t *)buffer_size = lVar1 + __n;
    if (lVar1 + __n < 200) {
      memcpy(*buffer,__s,__n);
      *buffer = *buffer + __n;
    }
  }
  lVar1 = *(long *)buffer_size;
  *(ulong *)buffer_size = lVar1 + 1U;
  if (lVar1 + 1U < 200) {
    **buffer = ')';
    *buffer = *buffer + 1;
  }
  return;
}

Assistant:

static void append_with_group(char **buffer, size_t buffer_size,
                              size_t *required_size,
                              const char *string, size_t length,
                              psa_dh_group_t group)
{
    const char *group_name = psa_dh_group_name(group);
    append(buffer, buffer_size, required_size, string, length);
    append(buffer, buffer_size, required_size, "(", 1);
    if (group_name != NULL) {
        append(buffer, buffer_size, required_size,
               group_name, strlen(group_name));
    } else {
        append_integer(buffer, buffer_size, required_size,
                       "0x%02x", group);
    }
    append(buffer, buffer_size, required_size, ")", 1);
}